

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void check_move_buffer(char *str,
                      basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *buffer)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  AssertHelper *this;
  allocator<char> *expected_expression;
  allocator<char> *expected;
  basic_buffer<char> *in_RSI;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> buffer2;
  allocator<char> *alloc;
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *in_stack_fffffffffffffe18;
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *in_stack_fffffffffffffe20;
  Secret *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *in_stack_fffffffffffffe38;
  int iVar4;
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  Type type;
  AssertHelper *in_stack_fffffffffffffe50;
  Message *in_stack_fffffffffffffe98;
  allocator_ref<std::allocator<char>_> in_stack_fffffffffffffea0;
  AssertionResult local_150 [2];
  allocator_ref<std::allocator<char>_> local_130;
  AssertionResult local_128 [2];
  size_t local_108;
  undefined4 local_fc;
  AssertionResult local_f8 [2];
  allocator local_d1;
  string local_d0 [32];
  AssertionResult local_b0 [2];
  allocator local_8d [13];
  string local_80 [32];
  AssertionResult local_60;
  basic_buffer<char> local_50;
  allocator_ref<std::allocator<char>_> local_20;
  allocator<char> *local_18;
  basic_buffer<char> *local_10;
  
  type = (Type)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_10 = in_RSI;
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::get_allocator
            (in_stack_fffffffffffffe18);
  local_18 = allocator_ref<std::allocator<char>_>::get(&local_20);
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::
  basic_memory_buffer(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  pcVar2 = fmt::v5::internal::basic_buffer<char>::operator[](local_10,0);
  sVar3 = fmt::v5::internal::basic_buffer<char>::size(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,pcVar2,sVar3,local_8d);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             (char **)in_stack_fffffffffffffe28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)local_8d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe50);
    testing::AssertionResult::failure_message((AssertionResult *)0x12457f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe50,type,(char *)in_stack_fffffffffffffe40,
               (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),in_stack_fffffffffffffe30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffea0.alloc_,in_stack_fffffffffffffe98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
    testing::Message::~Message((Message *)0x1245dc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12464d);
  pcVar2 = fmt::v5::internal::basic_buffer<char>::operator[](&local_50,0);
  this = (AssertHelper *)fmt::v5::internal::basic_buffer<char>::size(&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,pcVar2,(ulong)this,&local_d1);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             (char **)in_stack_fffffffffffffe28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b0);
  if (!bVar1) {
    testing::Message::Message((Message *)this);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x12477d);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this,type,(char *)in_stack_fffffffffffffe40,
               (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),in_stack_fffffffffffffe30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffea0.alloc_,in_stack_fffffffffffffe98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
    testing::Message::~Message((Message *)0x1247da);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124848);
  local_fc = 5;
  local_108 = fmt::v5::internal::basic_buffer<char>::capacity(&local_50);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             (uint *)in_stack_fffffffffffffe28,(unsigned_long *)in_stack_fffffffffffffe20);
  iVar4 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f8);
  if (!bVar1) {
    testing::Message::Message((Message *)this);
    in_stack_fffffffffffffe40 =
         (basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x1248db);
    testing::internal::AssertHelper::AssertHelper
              (this,type,(char *)in_stack_fffffffffffffe40,iVar4,in_stack_fffffffffffffe30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffea0.alloc_,in_stack_fffffffffffffe98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
    testing::Message::~Message((Message *)0x124938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1249a6);
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::get_allocator
            (in_stack_fffffffffffffe18);
  expected_expression = allocator_ref<std::allocator<char>_>::get(&local_130);
  testing::internal::EqHelper<true>::Compare<std::allocator<char>>
            ((char *)expected_expression,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (allocator<char> *)in_stack_fffffffffffffe20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_128);
  if (!bVar1) {
    testing::Message::Message((Message *)this);
    in_stack_fffffffffffffe30 =
         testing::AssertionResult::failure_message((AssertionResult *)0x124a3d);
    testing::internal::AssertHelper::AssertHelper
              (this,type,(char *)in_stack_fffffffffffffe40,(int)((ulong)expected_expression >> 0x20)
               ,in_stack_fffffffffffffe30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffea0.alloc_,in_stack_fffffffffffffe98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
    testing::Message::~Message((Message *)0x124a9a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124b0b);
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::get_allocator
            (in_stack_fffffffffffffe18);
  expected = allocator_ref<std::allocator<char>_>::get
                       ((allocator_ref<std::allocator<char>_> *)&stack0xfffffffffffffea0);
  testing::internal::EqHelper<false>::Compare<std::allocator<char>*,std::allocator<char>*>
            ((char *)expected_expression,in_stack_fffffffffffffe30,(allocator<char> **)expected,
             (allocator<char> **)in_stack_fffffffffffffe20);
  iVar4 = (int)((ulong)expected_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
  if (!bVar1) {
    testing::Message::Message((Message *)this);
    in_stack_fffffffffffffe20 =
         (basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x124bb6);
    testing::internal::AssertHelper::AssertHelper
              (this,type,(char *)in_stack_fffffffffffffe40,iVar4,in_stack_fffffffffffffe30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffea0.alloc_,in_stack_fffffffffffffe98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
    testing::Message::~Message((Message *)0x124c0a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124c72);
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::
  ~basic_memory_buffer(in_stack_fffffffffffffe20);
  return;
}

Assistant:

static void check_move_buffer(const char *str,
                       basic_memory_buffer<char, 5, TestAllocator> &buffer) {
  std::allocator<char> *alloc = buffer.get_allocator().get();
  basic_memory_buffer<char, 5, TestAllocator> buffer2(std::move(buffer));
  // Move shouldn't destroy the inline content of the first buffer.
  EXPECT_EQ(str, std::string(&buffer[0], buffer.size()));
  EXPECT_EQ(str, std::string(&buffer2[0], buffer2.size()));
  EXPECT_EQ(5u, buffer2.capacity());
  // Move should transfer allocator.
  EXPECT_EQ(FMT_NULL, buffer.get_allocator().get());
  EXPECT_EQ(alloc, buffer2.get_allocator().get());
}